

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O1

void __thiscall fc_layer_t::activate(fc_layer_t *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  int _x;
  long lVar5;
  int _y;
  int _z;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [64];
  
  if (0 < (this->super_layer_t).out.size.x) {
    lVar5 = 0;
    do {
      if ((this->super_layer_t).in.size.x < 1) {
        auVar6 = ZEXT816(0);
      }
      else {
        _x = 0;
        auVar8 = ZEXT864(0);
        do {
          if (0 < (this->super_layer_t).in.size.y) {
            _y = 0;
            do {
              if (0 < (this->super_layer_t).in.size.z) {
                _z = 0;
                do {
                  iVar1 = (this->super_layer_t).in.size.y;
                  iVar2 = (this->super_layer_t).in.size.x;
                  pfVar4 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,_z);
                  fVar7 = *pfVar4;
                  pfVar4 = tensor_t<float>::get
                                     (&this->weights,(iVar1 * _z + _y) * iVar2 + _x,(int)lVar5,0);
                  auVar6 = vfmadd231ss_fma(auVar8._0_16_,ZEXT416((uint)fVar7),ZEXT416((uint)*pfVar4)
                                          );
                  auVar8 = ZEXT1664(auVar6);
                  _z = _z + 1;
                } while (_z < (this->super_layer_t).in.size.z);
              }
              _y = _y + 1;
            } while (_y < (this->super_layer_t).in.size.y);
          }
          auVar6 = auVar8._0_16_;
          _x = _x + 1;
        } while (_x < (this->super_layer_t).in.size.x);
      }
      (this->input).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] = auVar6._0_4_;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(auVar6,auVar3);
      fVar7 = expf(auVar6._0_4_);
      pfVar4 = tensor_t<float>::get(&(this->super_layer_t).out,(int)lVar5,0,0);
      *pfVar4 = 1.0 / (fVar7 + 1.0);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_layer_t).out.size.x);
  }
  return;
}

Assistant:

void activate() {
    for (int n = 0; n < out.size.x; n++) {
      float inputv = 0;

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            inputv += in(i, j, z) * weights(m, n, 0);
          }

      input[n] = inputv;

      // activate function
      out(n, 0, 0) = activator_function(inputv);
    }
  }